

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O3

err_t btokSMRespWrap(octet *apdu,size_t *count,apdu_resp_t *resp,void *state)

{
  void *state_00;
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  bVar1 = apduRespIsValid(resp);
  if (bVar1 == 0) {
    return 0x138;
  }
  sVar2 = apduRespEnc(apdu,resp);
  if (sVar2 == 0xffffffffffffffff) {
    return 0x138;
  }
  if (state == (void *)0x0) {
    if (count == (size_t *)0x0) {
      return 0;
    }
  }
  else {
    sVar2 = resp->rdf_len;
    if (sVar2 == 0) {
      lVar4 = 2;
    }
    else {
      sVar3 = derTLEnc((octet *)0x0,0x87,sVar2 + 1);
      lVar4 = sVar2 + sVar3 + 3;
    }
    sVar2 = derEnc((octet *)0x0,0x8e,(void *)0x0,8);
    if (apdu == (octet *)0x0) {
      if (count == (size_t *)0x0) {
        return 0;
      }
      sVar2 = lVar4 + sVar2;
    }
    else {
      if ((*(byte *)((long)state + 0x40) & 1) != 0) {
        return 0x205;
      }
      if (resp->rdf_len == 0) {
        sVar2 = 0;
      }
      else {
        sVar2 = derTLEnc((octet *)0x0,0x87,resp->rdf_len + 1);
        memMove(apdu + sVar2 + 1,apdu,resp->rdf_len);
        apdu[sVar2] = '\x02';
        sVar2 = derTLEnc(apdu,0x87,resp->rdf_len + 1);
        beltCFBStart((void *)((long)state + 0x50),(octet *)((long)state + 0x20),0x20,
                     (octet *)((long)state + 0x40));
        beltCFBStepE(apdu + sVar2 + 1,resp->rdf_len,(void *)((long)state + 0x50));
        sVar2 = sVar2 + 1 + resp->rdf_len;
      }
      state_00 = (void *)((long)state + 0x50);
      beltMACStart(state_00,(octet *)state,0x20);
      beltMACStepA((octet *)((long)state + 0x40),0x10,state_00);
      beltMACStepA(apdu,sVar2,state_00);
      beltMACStepA(resp,1,state_00);
      beltMACStepA(&resp->sw2,1,state_00);
      sVar3 = derTLEnc(apdu + sVar2,0x8e,8);
      lVar4 = sVar3 + sVar2;
      beltMACStepG(apdu + lVar4,state_00);
      apdu[lVar4 + 8] = resp->sw1;
      apdu[lVar4 + 9] = resp->sw2;
      if (count == (size_t *)0x0) {
        return 0;
      }
      sVar2 = lVar4 + 10;
    }
  }
  *count = sVar2;
  return 0;
}

Assistant:

err_t btokSMRespWrap(octet apdu[], size_t* count, const apdu_resp_t* resp,
	void* state)
{
	size_t rdf_len;
	size_t offset;
	size_t c;
	btok_sm_st* st;
	// pre
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(count, O_PER_S));
	// корректный ответ?
	if (!apduRespIsValid(resp))
		return ERR_BAD_APDU;
	// кодировать без защиты
	offset = apduRespEnc(apdu, resp);
	if (offset == SIZE_MAX)
		return ERR_BAD_APDU;
	// состояние не задано, т.е. защита не нужна?
	if (!state)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, resp, apduRespSizeof(resp)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), resp, apduRespSizeof(resp)));
	// новая длина rdf
	rdf_len = resp->rdf_len;
	if (resp->rdf_len)
	{
		c = derTLEnc(0, 0x87, resp->rdf_len + 1);
		ASSERT(c != SIZE_MAX);
		rdf_len += c + 1;
	}
	c = derEnc(0, 0x8E, 0, 8);
	ASSERT(c != SIZE_MAX);
	rdf_len += c;
	// общая длина
	offset = rdf_len + 2;
	// не задан выходной буфер, т.е. нужно определить только его длину?
	if (!apdu)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
			ASSERT(memIsDisjoint2(count, O_PER_S, resp, apduRespSizeof(resp)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(apdu, offset, state, btokSM_keep()));
	ASSERT(memIsDisjoint2(apdu, offset, resp, apduRespSizeof(resp)));
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 0)
		return ERR_BAD_LOGIC;
	// обработать rdf
	offset = 0;
	if (resp->rdf_len)
	{
		c = derTLEnc(0, 0x87, resp->rdf_len + 1);
		ASSERT(c != SIZE_MAX);
		// подготовить значение
		memMove(apdu + c + 1, apdu, resp->rdf_len);
		apdu[c] = 0x02;
		// кодировать TL
		c = derTLEnc(apdu, 0x87, resp->rdf_len + 1);
		ASSERT(c != SIZE_MAX);
		offset += c + 1;
		// зашифровать
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepE(apdu + offset, resp->rdf_len, st->stack);
		// дальше
		offset += resp->rdf_len;
	}
	// вычислить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, offset, st->stack);
	beltMACStepA(&resp->sw1, 1, st->stack);
	beltMACStepA(&resp->sw2, 1, st->stack);
	c = derTLEnc(apdu + offset, 0x8E, 8);
	ASSERT(c != SIZE_MAX);
	offset += c;
	beltMACStepG(apdu + offset, st->stack);
	offset += 8;
	// кодировать статусы
	apdu[offset++] = resp->sw1, apdu[offset++] = resp->sw2;
	// возвратить длину
	if (count)
	{
		ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(count, O_PER_S, resp, apduRespSizeof(resp)));
		ASSERT(memIsDisjoint2(count, O_PER_S, apdu, offset));
		*count = offset;
	}
	// завершить
	return ERR_OK;
}